

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

IntersectClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::IntersectClauseSyntax,slang::syntax::IntersectClauseSyntax_const&>
          (BumpAllocator *this,IntersectClauseSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  RangeListSyntax *pRVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  IntersectClauseSyntax *pIVar10;
  
  pIVar10 = (IntersectClauseSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((IntersectClauseSyntax *)this->endPtr < pIVar10 + 1) {
    pIVar10 = (IntersectClauseSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pIVar10 + 1);
  }
  SVar8 = (args->super_SyntaxNode).kind;
  uVar9 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = (args->super_SyntaxNode).previewNode;
  TVar4 = (args->intersect).kind;
  uVar5 = (args->intersect).field_0x2;
  NVar6.raw = (args->intersect).numFlags.raw;
  uVar7 = (args->intersect).rawLen;
  pRVar3 = (args->ranges).ptr;
  (pIVar10->intersect).info = (args->intersect).info;
  (pIVar10->ranges).ptr = pRVar3;
  (pIVar10->super_SyntaxNode).previewNode = pSVar2;
  (pIVar10->intersect).kind = TVar4;
  (pIVar10->intersect).field_0x2 = uVar5;
  (pIVar10->intersect).numFlags = (NumericTokenFlags)NVar6.raw;
  (pIVar10->intersect).rawLen = uVar7;
  (pIVar10->super_SyntaxNode).kind = SVar8;
  *(undefined4 *)&(pIVar10->super_SyntaxNode).field_0x4 = uVar9;
  (pIVar10->super_SyntaxNode).parent = pSVar1;
  return pIVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }